

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.h
# Opt level: O2

void __thiscall RigidBodyDynamics::Joint::Joint(Joint *this,JointType type)

{
  SpatialVector *pSVar1;
  ostream *poVar2;
  RBDLError *pRVar3;
  string local_1d0;
  string local_1b0;
  ostringstream errormsg;
  
  this->mJointAxes = (SpatialVector *)0x0;
  this->mJointType = type;
  this->mDoFCount = 0;
  this->q_index = 0;
  this->custom_joint_index = 0xffffffff;
  switch(type) {
  case JointTypeRevoluteX:
    this->mDoFCount = 1;
    pSVar1 = (SpatialVector *)operator_new__(0x30);
    this->mJointAxes = pSVar1;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 1.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    goto LAB_00244c47;
  case JointTypeRevoluteY:
    this->mDoFCount = 1;
    pSVar1 = (SpatialVector *)operator_new__(0x30);
    this->mJointAxes = pSVar1;
    *(undefined4 *)
     (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array = 0;
    *(undefined4 *)
     ((long)(pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 4)
         = 0;
    *(undefined4 *)
     ((pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 1) = 0;
    *(undefined4 *)
     ((long)(pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array +
     0xc) = 0x3ff00000;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    break;
  case JointTypeRevoluteZ:
    this->mDoFCount = 1;
    pSVar1 = (SpatialVector *)operator_new__(0x30);
    this->mJointAxes = pSVar1;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 1.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
LAB_00244c47:
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    break;
  case JointTypeSpherical:
  case JointTypeEulerZYX:
    this->mDoFCount = 3;
    pSVar1 = (SpatialVector *)operator_new__(0x90);
    this->mJointAxes = pSVar1;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 1.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 1.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    pSVar1[2].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 1.0;
    pSVar1[2].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    pSVar1[2].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    pSVar1[2].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    pSVar1[2].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    goto LAB_00244d6a;
  case JointTypeEulerXYZ:
    this->mDoFCount = 3;
    pSVar1 = (SpatialVector *)operator_new__(0x90);
    this->mJointAxes = pSVar1;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 1.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 1.0;
    pSVar1[2].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pSVar1[2].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    goto LAB_00244d62;
  case JointTypeEulerYXZ:
    this->mDoFCount = 3;
    pSVar1 = (SpatialVector *)operator_new__(0x90);
    this->mJointAxes = pSVar1;
    *(undefined4 *)
     (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array = 0;
    *(undefined4 *)
     ((long)(pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 4)
         = 0;
    *(undefined4 *)
     ((pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array + 1) = 0;
    *(undefined4 *)
     ((long)(pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array +
     0xc) = 0x3ff00000;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 1.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    pSVar1[2].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    pSVar1[2].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
LAB_00244d62:
    pSVar1[2].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 1.0;
    pSVar1[2].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    pSVar1[2].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
LAB_00244d6a:
    pSVar1[2].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    break;
  case JointTypeTranslationXYZ:
    this->mDoFCount = 3;
    pSVar1 = (SpatialVector *)operator_new__(0x90);
    this->mJointAxes = pSVar1;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 1.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    (pSVar1->super_Matrix<double,_6,_1,_0,_6,_1>).
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 1.0;
    pSVar1[2].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = 0.0;
    pSVar1[2].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = 0.0;
    pSVar1[2].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] = 0.0;
    pSVar1[2].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] = 0.0;
    pSVar1[1].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 0.0;
    pSVar1[2].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] = 0.0;
    pSVar1[2].super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = 1.0;
    break;
  default:
    if (type - JointType1DoF < 6) {
      this->mDoFCount = type - JointTypeHelical;
      pSVar1 = (SpatialVector *)operator_new__((ulong)(type - JointTypeHelical) * 0x30);
      this->mJointAxes = pSVar1;
      poVar2 = std::operator<<((ostream *)&std::cerr,"Warning: uninitalized vector");
      std::endl<char,std::char_traits<char>>(poVar2);
      return;
    }
    if (type == JointTypeCustom) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&errormsg);
      poVar2 = std::operator<<((ostream *)&errormsg,
                               "Error: Invalid use of Joint constructor Joint(JointType");
      poVar2 = std::operator<<(poVar2," type). Only allowed when type != JointTypeCustom");
      std::endl<char,std::char_traits<char>>(poVar2);
      pRVar3 = (RBDLError *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      Errors::RBDLError::RBDLError(pRVar3,&local_1b0);
      __cxa_throw(pRVar3,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
    }
    if (type - JointTypeHelical < 0xfffffffe) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&errormsg);
      poVar2 = std::operator<<((ostream *)&errormsg,
                               "Error: Invalid use of Joint constructor Joint(JointType type). Only allowed when type == JointTypeFixed or JointTypeSpherical."
                              );
      std::endl<char,std::char_traits<char>>(poVar2);
      pRVar3 = (RBDLError *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      Errors::RBDLError::RBDLError(pRVar3,&local_1d0);
      __cxa_throw(pRVar3,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
    }
  }
  return;
}

Assistant:

Joint (JointType type) :
    mJointAxes (NULL),
    mJointType (type),
    mDoFCount (0),
    q_index (0),
    custom_joint_index(-1)
  {
    if (type == JointTypeRevoluteX) {
      mDoFCount = 1;
      mJointAxes = new Math::SpatialVector[mDoFCount];
      mJointAxes[0] = Math::SpatialVector (1., 0., 0., 0., 0., 0.);
    } else if (type == JointTypeRevoluteY) {
      mDoFCount = 1;
      mJointAxes = new Math::SpatialVector[mDoFCount];
      mJointAxes[0] = Math::SpatialVector (0., 1., 0., 0., 0., 0.);
    } else if (type == JointTypeRevoluteZ) {
      mDoFCount = 1;
      mJointAxes = new Math::SpatialVector[mDoFCount];
      mJointAxes[0] = Math::SpatialVector (0., 0., 1., 0., 0., 0.);
    } else if (type == JointTypeSpherical) {
      mDoFCount = 3;

      mJointAxes = new Math::SpatialVector[mDoFCount];

      mJointAxes[0] = Math::SpatialVector (0., 0., 1., 0., 0., 0.);
      mJointAxes[1] = Math::SpatialVector (0., 1., 0., 0., 0., 0.);
      mJointAxes[2] = Math::SpatialVector (1., 0., 0., 0., 0., 0.);
    } else if (type == JointTypeEulerZYX) {
      mDoFCount = 3;

      mJointAxes = new Math::SpatialVector[mDoFCount];

      mJointAxes[0] = Math::SpatialVector (0., 0., 1., 0., 0., 0.);
      mJointAxes[1] = Math::SpatialVector (0., 1., 0., 0., 0., 0.);
      mJointAxes[2] = Math::SpatialVector (1., 0., 0., 0., 0., 0.);
    } else if (type == JointTypeEulerXYZ) {
      mDoFCount = 3;

      mJointAxes = new Math::SpatialVector[mDoFCount];

      mJointAxes[0] = Math::SpatialVector (1., 0., 0., 0., 0., 0.);
      mJointAxes[1] = Math::SpatialVector (0., 1., 0., 0., 0., 0.);
      mJointAxes[2] = Math::SpatialVector (0., 0., 1., 0., 0., 0.);
    } else if (type == JointTypeEulerYXZ) {
      mDoFCount = 3;

      mJointAxes = new Math::SpatialVector[mDoFCount];

      mJointAxes[0] = Math::SpatialVector (0., 1., 0., 0., 0., 0.);
      mJointAxes[1] = Math::SpatialVector (1., 0., 0., 0., 0., 0.);
      mJointAxes[2] = Math::SpatialVector (0., 0., 1., 0., 0., 0.);
    } else if (type == JointTypeTranslationXYZ) {
      mDoFCount = 3;

      mJointAxes = new Math::SpatialVector[mDoFCount];

      mJointAxes[0] = Math::SpatialVector (0., 0., 0., 1., 0., 0.);
      mJointAxes[1] = Math::SpatialVector (0., 0., 0., 0., 1., 0.);
      mJointAxes[2] = Math::SpatialVector (0., 0., 0., 0., 0., 1.);
    } else if (type >= JointType1DoF && type <= JointType6DoF) {
      // create a joint and allocate memory for it.
      // Warning: the memory does not get initialized by this function!
      mDoFCount = type - JointType1DoF + 1;
      mJointAxes = new Math::SpatialVector[mDoFCount];
      std::cerr << "Warning: uninitalized vector" << std::endl;
    } else if (type == JointTypeCustom) {
      //This constructor cannot be used for a JointTypeCustom because
      //we have no idea what mDoFCount is.
      std::ostringstream errormsg;
      errormsg  << "Error: Invalid use of Joint constructor Joint(JointType"
                << " type). Only allowed when type != JointTypeCustom"
                << std::endl;
      throw Errors::RBDLError(errormsg.str());
    } else if (type != JointTypeFixed && type != JointTypeFloatingBase) {
      std::ostringstream errormsg;
      errormsg <<
               "Error: Invalid use of Joint constructor Joint(JointType type). Only allowed when type == JointTypeFixed or JointTypeSpherical."
               << std::endl;
      throw Errors::RBDLError(errormsg.str());
    }
  }